

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O0

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::pop_front(CircularArray<wabt::Token,_2UL> *this)

{
  reference element;
  CircularArray<wabt::Token,_2UL> *this_local;
  
  if (this->size_ != 0) {
    element = front(this);
    SetElement<>(this,element);
    this->front_ = this->front_ + 1 & 1;
    this->size_ = this->size_ - 1;
    return;
  }
  __assert_fail("size_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                ,0x56,
                "void wabt::CircularArray<wabt::Token, 2>::pop_front() [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void pop_front() {
    assert(size_ > 0);
    SetElement(front());
    front_ = (front_ + 1) & kMask;
    --size_;
  }